

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int open_set_hostname(OPEN_HANDLE open,char *hostname_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE hostname_amqp_value;
  OPEN_INSTANCE *open_instance;
  int result;
  char *hostname_value_local;
  OPEN_HANDLE open_local;
  
  if (open == (OPEN_HANDLE)0x0) {
    open_instance._4_4_ = 0x4db;
  }
  else {
    item_value = amqpvalue_create_string(hostname_value);
    if (item_value == (AMQP_VALUE)0x0) {
      open_instance._4_4_ = 0x4e3;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(open->composite_value,1,item_value);
      if (iVar1 == 0) {
        open_instance._4_4_ = 0;
      }
      else {
        open_instance._4_4_ = 0x4e9;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return open_instance._4_4_;
}

Assistant:

int open_set_hostname(OPEN_HANDLE open, const char* hostname_value)
{
    int result;

    if (open == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)open;
        AMQP_VALUE hostname_amqp_value = amqpvalue_create_string(hostname_value);
        if (hostname_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(open_instance->composite_value, 1, hostname_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(hostname_amqp_value);
        }
    }

    return result;
}